

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  ulong uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 (*pauVar54) [16];
  uint uVar55;
  long lVar56;
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  undefined1 (*pauVar62) [16];
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  float fVar66;
  float fVar73;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar71;
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar70 [64];
  float fVar77;
  undefined1 auVar78 [16];
  float fVar85;
  undefined1 auVar80 [32];
  undefined1 auVar79 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar86;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar94;
  float fVar106;
  float fVar107;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar100 [32];
  undefined1 auVar98 [16];
  undefined1 auVar101 [32];
  float fVar108;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar99 [16];
  undefined1 auVar105 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar115;
  float fVar116;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar120 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar143 [32];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar144 [64];
  float fVar163;
  float fVar164;
  undefined1 auVar165 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar166 [64];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [64];
  float fVar189;
  float fVar190;
  undefined1 auVar191 [32];
  float fVar195;
  float fVar197;
  float fVar199;
  float fVar201;
  float fVar203;
  float fVar205;
  undefined1 auVar192 [32];
  float fVar194;
  float fVar196;
  float fVar198;
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar193 [64];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  float fVar210;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_151c;
  ulong local_1518;
  RayHit *local_1510;
  RayQueryContext *local_1508;
  undefined8 local_1500;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  undefined8 local_14e0;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  long local_14c0;
  long local_14b8;
  RTCFilterFunctionNArguments local_14b0;
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_1450;
  float local_144c;
  float local_1448;
  undefined4 local_1444;
  undefined4 local_1440;
  undefined4 local_143c;
  uint local_1438;
  uint local_1434;
  uint local_1430;
  undefined1 local_1420 [32];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar62 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar78 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar87 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar67 = vandps_avx((undefined1  [16])aVar2,auVar67);
    auVar99._8_4_ = 0x219392ef;
    auVar99._0_8_ = 0x219392ef219392ef;
    auVar99._12_4_ = 0x219392ef;
    auVar67 = vcmpps_avx(auVar67,auVar99,1);
    auVar117._8_4_ = 0x3f800000;
    auVar117._0_8_ = 0x3f8000003f800000;
    auVar117._12_4_ = 0x3f800000;
    auVar99 = vdivps_avx(auVar117,(undefined1  [16])aVar2);
    auVar118._8_4_ = 0x5d5e0b6b;
    auVar118._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar118._12_4_ = 0x5d5e0b6b;
    auVar67 = vblendvps_avx(auVar99,auVar118,auVar67);
    auVar112._0_4_ = auVar67._0_4_ * 0.99999964;
    auVar112._4_4_ = auVar67._4_4_ * 0.99999964;
    auVar112._8_4_ = auVar67._8_4_ * 0.99999964;
    auVar112._12_4_ = auVar67._12_4_ * 0.99999964;
    auVar95._0_4_ = auVar67._0_4_ * 1.0000004;
    auVar95._4_4_ = auVar67._4_4_ * 1.0000004;
    auVar95._8_4_ = auVar67._8_4_ * 1.0000004;
    auVar95._12_4_ = auVar67._12_4_ * 1.0000004;
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1310._4_4_ = uVar1;
    local_1310._0_4_ = uVar1;
    local_1310._8_4_ = uVar1;
    local_1310._12_4_ = uVar1;
    auVar139 = ZEXT1664(local_1310);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1320._4_4_ = uVar1;
    local_1320._0_4_ = uVar1;
    local_1320._8_4_ = uVar1;
    local_1320._12_4_ = uVar1;
    auVar144 = ZEXT1664(local_1320);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1330._4_4_ = uVar1;
    local_1330._0_4_ = uVar1;
    local_1330._8_4_ = uVar1;
    local_1330._12_4_ = uVar1;
    auVar166 = ZEXT1664(local_1330);
    local_1340 = vshufps_avx(auVar112,auVar112,0);
    auVar180 = ZEXT1664(local_1340);
    auVar67 = vmovshdup_avx(auVar112);
    local_1350 = vshufps_avx(auVar112,auVar112,0x55);
    auVar182 = ZEXT1664(local_1350);
    auVar99 = vshufpd_avx(auVar112,auVar112,1);
    local_1360 = vshufps_avx(auVar112,auVar112,0xaa);
    auVar193 = ZEXT1664(local_1360);
    local_1370 = vshufps_avx(auVar95,auVar95,0);
    auVar207 = ZEXT1664(local_1370);
    local_1380 = vshufps_avx(auVar95,auVar95,0x55);
    auVar209 = ZEXT1664(local_1380);
    local_1390 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar211 = ZEXT1664(local_1390);
    uVar61 = (ulong)(auVar112._0_4_ < 0.0) << 4;
    uVar60 = (ulong)(auVar67._0_4_ < 0.0) << 4 | 0x20;
    uVar59 = (ulong)(auVar99._0_4_ < 0.0) << 4 | 0x40;
    uVar63 = uVar61 ^ 0x10;
    local_13f0 = vshufps_avx(auVar78,auVar78,0);
    auVar136 = ZEXT1664(local_13f0);
    auVar67 = vshufps_avx(auVar87,auVar87,0);
    auVar70 = ZEXT1664(auVar67);
    local_1100._16_16_ = mm_lookupmask_ps._240_16_;
    local_1100._0_16_ = mm_lookupmask_ps._0_16_;
    auVar100._8_4_ = 0x3f800000;
    auVar100._0_8_ = 0x3f8000003f800000;
    auVar100._12_4_ = 0x3f800000;
    auVar100._16_4_ = 0x3f800000;
    auVar100._20_4_ = 0x3f800000;
    auVar100._24_4_ = 0x3f800000;
    auVar100._28_4_ = 0x3f800000;
    auVar80._8_4_ = 0xbf800000;
    auVar80._0_8_ = 0xbf800000bf800000;
    auVar80._12_4_ = 0xbf800000;
    auVar80._16_4_ = 0xbf800000;
    auVar80._20_4_ = 0xbf800000;
    auVar80._24_4_ = 0xbf800000;
    auVar80._28_4_ = 0xbf800000;
    _local_1120 = vblendvps_avx(auVar100,auVar80,local_1100);
    local_1508 = context;
    local_1510 = ray;
    local_1518 = uVar61;
LAB_00b77d16:
    if (pauVar62 != (undefined1 (*) [16])&local_fa0) {
      pauVar54 = pauVar62 + -1;
      pauVar62 = pauVar62 + -1;
      if (*(float *)(*pauVar54 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar65 = *(ulong *)*pauVar62;
        while ((uVar65 & 8) == 0) {
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar61),auVar139._0_16_);
          auVar78._0_4_ = auVar180._0_4_ * auVar67._0_4_;
          auVar78._4_4_ = auVar180._4_4_ * auVar67._4_4_;
          auVar78._8_4_ = auVar180._8_4_ * auVar67._8_4_;
          auVar78._12_4_ = auVar180._12_4_ * auVar67._12_4_;
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar60),auVar144._0_16_);
          auVar87._0_4_ = auVar182._0_4_ * auVar67._0_4_;
          auVar87._4_4_ = auVar182._4_4_ * auVar67._4_4_;
          auVar87._8_4_ = auVar182._8_4_ * auVar67._8_4_;
          auVar87._12_4_ = auVar182._12_4_ * auVar67._12_4_;
          auVar67 = vmaxps_avx(auVar78,auVar87);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar59),auVar166._0_16_);
          auVar88._0_4_ = auVar193._0_4_ * auVar99._0_4_;
          auVar88._4_4_ = auVar193._4_4_ * auVar99._4_4_;
          auVar88._8_4_ = auVar193._8_4_ * auVar99._8_4_;
          auVar88._12_4_ = auVar193._12_4_ * auVar99._12_4_;
          auVar99 = vmaxps_avx(auVar88,auVar136._0_16_);
          auVar99 = vmaxps_avx(auVar67,auVar99);
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar63),auVar139._0_16_);
          auVar89._0_4_ = auVar207._0_4_ * auVar67._0_4_;
          auVar89._4_4_ = auVar207._4_4_ * auVar67._4_4_;
          auVar89._8_4_ = auVar207._8_4_ * auVar67._8_4_;
          auVar89._12_4_ = auVar207._12_4_ * auVar67._12_4_;
          auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + (uVar60 ^ 0x10)),
                               auVar144._0_16_);
          auVar96._0_4_ = auVar209._0_4_ * auVar67._0_4_;
          auVar96._4_4_ = auVar209._4_4_ * auVar67._4_4_;
          auVar96._8_4_ = auVar209._8_4_ * auVar67._8_4_;
          auVar96._12_4_ = auVar209._12_4_ * auVar67._12_4_;
          auVar67 = vminps_avx(auVar89,auVar96);
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + (uVar59 ^ 0x10)),
                               auVar166._0_16_);
          auVar97._0_4_ = auVar211._0_4_ * auVar78._0_4_;
          auVar97._4_4_ = auVar211._4_4_ * auVar78._4_4_;
          auVar97._8_4_ = auVar211._8_4_ * auVar78._8_4_;
          auVar97._12_4_ = auVar211._12_4_ * auVar78._12_4_;
          auVar78 = vminps_avx(auVar97,auVar70._0_16_);
          auVar67 = vminps_avx(auVar67,auVar78);
          auVar67 = vcmpps_avx(auVar99,auVar67,2);
          uVar55 = vmovmskps_avx(auVar67);
          local_12e0._0_16_ = auVar99;
          if (uVar55 == 0) goto LAB_00b77d16;
          uVar55 = uVar55 & 0xff;
          uVar64 = uVar65 & 0xfffffffffffffff0;
          lVar11 = 0;
          if (uVar55 != 0) {
            for (; (uVar55 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar65 = *(ulong *)(uVar64 + lVar11 * 8);
          uVar55 = uVar55 - 1 & uVar55;
          if (uVar55 != 0) {
            uVar58 = *(uint *)(local_12e0 + lVar11 * 4);
            lVar11 = 0;
            if (uVar55 != 0) {
              for (; (uVar55 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            uVar3 = *(ulong *)(uVar64 + lVar11 * 8);
            uVar57 = *(uint *)(local_12e0 + lVar11 * 4);
            uVar55 = uVar55 - 1 & uVar55;
            if (uVar55 == 0) {
              if (uVar58 < uVar57) {
                *(ulong *)*pauVar62 = uVar3;
                *(uint *)(*pauVar62 + 8) = uVar57;
                pauVar62 = pauVar62 + 1;
              }
              else {
                *(ulong *)*pauVar62 = uVar65;
                *(uint *)(*pauVar62 + 8) = uVar58;
                pauVar62 = pauVar62 + 1;
                uVar65 = uVar3;
              }
            }
            else {
              auVar79._8_8_ = 0;
              auVar79._0_8_ = uVar65;
              auVar67 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar58));
              auVar90._8_8_ = 0;
              auVar90._0_8_ = uVar3;
              auVar99 = vpunpcklqdq_avx(auVar90,ZEXT416(uVar57));
              lVar11 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              auVar98._8_8_ = 0;
              auVar98._0_8_ = *(ulong *)(uVar64 + lVar11 * 8);
              auVar87 = vpunpcklqdq_avx(auVar98,ZEXT416(*(uint *)(local_12e0 + lVar11 * 4)));
              auVar78 = vpcmpgtd_avx(auVar99,auVar67);
              uVar55 = uVar55 - 1 & uVar55;
              if (uVar55 == 0) {
                auVar95 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar99,auVar67,auVar95);
                auVar67 = vblendvps_avx(auVar67,auVar99,auVar95);
                auVar99 = vpcmpgtd_avx(auVar87,auVar78);
                auVar95 = vpshufd_avx(auVar99,0xaa);
                auVar99 = vblendvps_avx(auVar87,auVar78,auVar95);
                auVar78 = vblendvps_avx(auVar78,auVar87,auVar95);
                auVar87 = vpcmpgtd_avx(auVar78,auVar67);
                auVar95 = vpshufd_avx(auVar87,0xaa);
                auVar87 = vblendvps_avx(auVar78,auVar67,auVar95);
                auVar67 = vblendvps_avx(auVar67,auVar78,auVar95);
                *pauVar62 = auVar67;
                pauVar62[1] = auVar87;
                uVar65 = auVar99._0_8_;
                pauVar62 = pauVar62 + 2;
              }
              else {
                lVar11 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                auVar119._8_8_ = 0;
                auVar119._0_8_ = *(ulong *)(uVar64 + lVar11 * 8);
                auVar112 = vpunpcklqdq_avx(auVar119,ZEXT416(*(uint *)(local_12e0 + lVar11 * 4)));
                auVar95 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar99,auVar67,auVar95);
                auVar67 = vblendvps_avx(auVar67,auVar99,auVar95);
                auVar99 = vpcmpgtd_avx(auVar112,auVar87);
                auVar95 = vpshufd_avx(auVar99,0xaa);
                auVar99 = vblendvps_avx(auVar112,auVar87,auVar95);
                auVar87 = vblendvps_avx(auVar87,auVar112,auVar95);
                auVar95 = vpcmpgtd_avx(auVar87,auVar67);
                auVar112 = vpshufd_avx(auVar95,0xaa);
                auVar95 = vblendvps_avx(auVar87,auVar67,auVar112);
                auVar67 = vblendvps_avx(auVar67,auVar87,auVar112);
                auVar87 = vpcmpgtd_avx(auVar99,auVar78);
                auVar112 = vpshufd_avx(auVar87,0xaa);
                auVar87 = vblendvps_avx(auVar99,auVar78,auVar112);
                auVar99 = vblendvps_avx(auVar78,auVar99,auVar112);
                auVar78 = vpcmpgtd_avx(auVar95,auVar99);
                auVar112 = vpshufd_avx(auVar78,0xaa);
                auVar78 = vblendvps_avx(auVar95,auVar99,auVar112);
                auVar99 = vblendvps_avx(auVar99,auVar95,auVar112);
                *pauVar62 = auVar67;
                pauVar62[1] = auVar99;
                pauVar62[2] = auVar78;
                auVar136 = ZEXT1664(local_13f0);
                uVar65 = auVar87._0_8_;
                pauVar62 = pauVar62 + 3;
              }
            }
          }
        }
        local_14c0 = (ulong)((uint)uVar65 & 0xf) - 8;
        uVar65 = uVar65 & 0xfffffffffffffff0;
        for (local_14b8 = 0; local_14b8 != local_14c0; local_14b8 = local_14b8 + 1) {
          lVar56 = local_14b8 * 0x60;
          pSVar4 = context->scene;
          ppfVar5 = (pSVar4->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar65 + 0x40 + lVar56)];
          pfVar7 = ppfVar5[*(uint *)(uVar65 + 0x44 + lVar56)];
          pfVar8 = ppfVar5[*(uint *)(uVar65 + 0x48 + lVar56)];
          pfVar9 = ppfVar5[*(uint *)(uVar65 + 0x4c + lVar56)];
          auVar78 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar65 + lVar56)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar65 + 8 + lVar56)));
          auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar65 + lVar56)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar65 + 8 + lVar56)));
          auVar87 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar65 + 4 + lVar56)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar65 + 0xc + lVar56)))
          ;
          auVar99 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar65 + 4 + lVar56)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar65 + 0xc + lVar56)))
          ;
          auVar112 = vunpcklps_avx(auVar67,auVar99);
          auVar117 = vunpcklps_avx(auVar78,auVar87);
          auVar67 = vunpckhps_avx(auVar78,auVar87);
          auVar87 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar65 + 0x10 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar65 + 0x18 + lVar56)));
          auVar99 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar65 + 0x10 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar65 + 0x18 + lVar56)));
          auVar95 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar65 + 0x14 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar65 + 0x1c + lVar56)));
          auVar78 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar65 + 0x14 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar65 + 0x1c + lVar56)));
          auVar118 = vunpcklps_avx(auVar99,auVar78);
          auVar88 = vunpcklps_avx(auVar87,auVar95);
          auVar99 = vunpckhps_avx(auVar87,auVar95);
          auVar95 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar65 + 0x20 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar65 + 0x28 + lVar56)));
          auVar78 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar65 + 0x20 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar65 + 0x28 + lVar56)));
          auVar89 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar65 + 0x24 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar65 + 0x2c + lVar56)));
          auVar87 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar65 + 0x24 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar65 + 0x2c + lVar56)));
          auVar96 = vunpcklps_avx(auVar78,auVar87);
          auVar97 = vunpcklps_avx(auVar95,auVar89);
          auVar78 = vunpckhps_avx(auVar95,auVar89);
          auVar89 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar65 + 0x30 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar65 + 0x38 + lVar56)));
          auVar87 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar65 + 0x30 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar65 + 0x38 + lVar56)));
          auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar65 + 0x34 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar65 + 0x3c + lVar56)));
          auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar65 + 0x34 + lVar56))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar65 + 0x3c + lVar56)));
          auVar95 = vunpcklps_avx(auVar87,auVar95);
          auVar90 = vunpcklps_avx(auVar89,auVar79);
          lVar11 = uVar65 + 0x40 + lVar56;
          local_fc0 = *(undefined8 *)(lVar11 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar11 + 0x18);
          auVar87 = vunpckhps_avx(auVar89,auVar79);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          lVar56 = uVar65 + 0x50 + lVar56;
          local_1300 = *(undefined8 *)(lVar56 + 0x10);
          uStack_12f8 = *(undefined8 *)(lVar56 + 0x18);
          uStack_12f0 = local_1300;
          uStack_12e8 = uStack_12f8;
          auVar120._16_16_ = auVar97;
          auVar120._0_16_ = auVar117;
          auVar137._16_16_ = auVar78;
          auVar137._0_16_ = auVar67;
          auVar81._16_16_ = auVar96;
          auVar81._0_16_ = auVar112;
          auVar134._16_16_ = auVar88;
          auVar134._0_16_ = auVar88;
          auVar165._16_16_ = auVar99;
          auVar165._0_16_ = auVar99;
          auVar91._16_16_ = auVar118;
          auVar91._0_16_ = auVar118;
          auVar179._16_16_ = auVar90;
          auVar179._0_16_ = auVar90;
          auVar143._16_16_ = auVar87;
          auVar143._0_16_ = auVar87;
          auVar101._16_16_ = auVar95;
          auVar101._0_16_ = auVar95;
          uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar191._4_4_ = uVar1;
          auVar191._0_4_ = uVar1;
          auVar191._8_4_ = uVar1;
          auVar191._12_4_ = uVar1;
          auVar191._16_4_ = uVar1;
          auVar191._20_4_ = uVar1;
          auVar191._24_4_ = uVar1;
          auVar191._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar206._4_4_ = uVar1;
          auVar206._0_4_ = uVar1;
          auVar206._8_4_ = uVar1;
          auVar206._12_4_ = uVar1;
          auVar206._16_4_ = uVar1;
          auVar206._20_4_ = uVar1;
          auVar206._24_4_ = uVar1;
          auVar206._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar208._4_4_ = uVar1;
          auVar208._0_4_ = uVar1;
          auVar208._8_4_ = uVar1;
          auVar208._12_4_ = uVar1;
          auVar208._16_4_ = uVar1;
          auVar208._20_4_ = uVar1;
          auVar208._24_4_ = uVar1;
          auVar208._28_4_ = uVar1;
          local_13c0 = vsubps_avx(auVar120,auVar191);
          local_13e0 = vsubps_avx(auVar137,auVar206);
          local_fe0 = vsubps_avx(auVar81,auVar208);
          auVar80 = vsubps_avx(auVar134,auVar191);
          auVar100 = vsubps_avx(auVar165,auVar206);
          auVar19 = vsubps_avx(auVar91,auVar208);
          auVar20 = vsubps_avx(auVar179,auVar191);
          auVar21 = vsubps_avx(auVar143,auVar206);
          auVar22 = vsubps_avx(auVar101,auVar208);
          local_1000 = vsubps_avx(auVar20,local_13c0);
          local_1020 = vsubps_avx(auVar21,local_13e0);
          local_1040 = vsubps_avx(auVar22,local_fe0);
          fVar12 = local_13e0._0_4_;
          fVar115 = auVar21._0_4_ + fVar12;
          fVar13 = local_13e0._4_4_;
          fVar121 = auVar21._4_4_ + fVar13;
          fVar14 = local_13e0._8_4_;
          fVar123 = auVar21._8_4_ + fVar14;
          fVar15 = local_13e0._12_4_;
          fVar125 = auVar21._12_4_ + fVar15;
          fVar16 = local_13e0._16_4_;
          fVar127 = auVar21._16_4_ + fVar16;
          fVar17 = local_13e0._20_4_;
          fVar129 = auVar21._20_4_ + fVar17;
          fVar18 = local_13e0._24_4_;
          fVar131 = auVar21._24_4_ + fVar18;
          fVar77 = local_13e0._28_4_;
          fVar210 = local_fe0._0_4_;
          fVar140 = fVar210 + auVar22._0_4_;
          fVar212 = local_fe0._4_4_;
          fVar145 = fVar212 + auVar22._4_4_;
          fVar213 = local_fe0._8_4_;
          fVar148 = fVar213 + auVar22._8_4_;
          fVar214 = local_fe0._12_4_;
          fVar151 = fVar214 + auVar22._12_4_;
          fVar215 = local_fe0._16_4_;
          fVar154 = fVar215 + auVar22._16_4_;
          fVar216 = local_fe0._20_4_;
          fVar157 = fVar216 + auVar22._20_4_;
          fVar217 = local_fe0._24_4_;
          fVar160 = fVar217 + auVar22._24_4_;
          fVar170 = local_fe0._28_4_;
          fVar66 = local_1040._0_4_;
          fVar71 = local_1040._4_4_;
          auVar23._4_4_ = fVar71 * fVar121;
          auVar23._0_4_ = fVar66 * fVar115;
          fVar72 = local_1040._8_4_;
          auVar23._8_4_ = fVar72 * fVar123;
          fVar73 = local_1040._12_4_;
          auVar23._12_4_ = fVar73 * fVar125;
          fVar74 = local_1040._16_4_;
          auVar23._16_4_ = fVar74 * fVar127;
          fVar75 = local_1040._20_4_;
          auVar23._20_4_ = fVar75 * fVar129;
          fVar76 = local_1040._24_4_;
          auVar23._24_4_ = fVar76 * fVar131;
          auVar23._28_4_ = auVar99._12_4_;
          fVar189 = local_1020._0_4_;
          fVar194 = local_1020._4_4_;
          auVar24._4_4_ = fVar194 * fVar145;
          auVar24._0_4_ = fVar189 * fVar140;
          fVar196 = local_1020._8_4_;
          auVar24._8_4_ = fVar196 * fVar148;
          fVar198 = local_1020._12_4_;
          auVar24._12_4_ = fVar198 * fVar151;
          fVar200 = local_1020._16_4_;
          auVar24._16_4_ = fVar200 * fVar154;
          fVar202 = local_1020._20_4_;
          auVar24._20_4_ = fVar202 * fVar157;
          fVar204 = local_1020._24_4_;
          auVar24._24_4_ = fVar204 * fVar160;
          auVar24._28_4_ = auVar90._12_4_;
          auVar23 = vsubps_avx(auVar24,auVar23);
          fVar181 = local_13c0._0_4_;
          fVar163 = fVar181 + auVar20._0_4_;
          fVar183 = local_13c0._4_4_;
          fVar167 = fVar183 + auVar20._4_4_;
          fVar184 = local_13c0._8_4_;
          fVar169 = fVar184 + auVar20._8_4_;
          fVar185 = local_13c0._12_4_;
          fVar171 = fVar185 + auVar20._12_4_;
          fVar186 = local_13c0._16_4_;
          fVar173 = fVar186 + auVar20._16_4_;
          fVar187 = local_13c0._20_4_;
          fVar175 = fVar187 + auVar20._20_4_;
          fVar188 = local_13c0._24_4_;
          fVar177 = fVar188 + auVar20._24_4_;
          fVar85 = local_1000._0_4_;
          fVar86 = local_1000._4_4_;
          auVar25._4_4_ = fVar145 * fVar86;
          auVar25._0_4_ = fVar140 * fVar85;
          fVar140 = local_1000._8_4_;
          auVar25._8_4_ = fVar148 * fVar140;
          fVar145 = local_1000._12_4_;
          auVar25._12_4_ = fVar151 * fVar145;
          fVar148 = local_1000._16_4_;
          auVar25._16_4_ = fVar154 * fVar148;
          fVar151 = local_1000._20_4_;
          auVar25._20_4_ = fVar157 * fVar151;
          fVar154 = local_1000._24_4_;
          auVar25._24_4_ = fVar160 * fVar154;
          auVar25._28_4_ = fVar170 + auVar22._28_4_;
          auVar81 = local_1040;
          auVar26._4_4_ = fVar167 * fVar71;
          auVar26._0_4_ = fVar163 * fVar66;
          auVar26._8_4_ = fVar169 * fVar72;
          auVar26._12_4_ = fVar171 * fVar73;
          auVar26._16_4_ = fVar173 * fVar74;
          auVar26._20_4_ = fVar175 * fVar75;
          auVar26._24_4_ = fVar177 * fVar76;
          auVar26._28_4_ = auVar90._12_4_;
          auVar24 = vsubps_avx(auVar26,auVar25);
          auVar27._4_4_ = fVar194 * fVar167;
          auVar27._0_4_ = fVar189 * fVar163;
          auVar27._8_4_ = fVar196 * fVar169;
          auVar27._12_4_ = fVar198 * fVar171;
          auVar27._16_4_ = fVar200 * fVar173;
          auVar27._20_4_ = fVar202 * fVar175;
          auVar27._24_4_ = fVar204 * fVar177;
          auVar27._28_4_ = local_13c0._28_4_ + auVar20._28_4_;
          auVar28._4_4_ = fVar86 * fVar121;
          auVar28._0_4_ = fVar85 * fVar115;
          auVar28._8_4_ = fVar140 * fVar123;
          auVar28._12_4_ = fVar145 * fVar125;
          auVar28._16_4_ = fVar148 * fVar127;
          auVar28._20_4_ = fVar151 * fVar129;
          auVar28._24_4_ = fVar154 * fVar131;
          auVar28._28_4_ = auVar21._28_4_ + fVar77;
          auVar25 = vsubps_avx(auVar28,auVar27);
          local_14e0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_1480._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_1500._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_1080._0_4_ =
               local_1500._4_4_ * auVar23._0_4_ +
               local_14e0._4_4_ * auVar24._0_4_ + (float)local_1480._4_4_ * auVar25._0_4_;
          local_1080._4_4_ =
               local_1500._4_4_ * auVar23._4_4_ +
               local_14e0._4_4_ * auVar24._4_4_ + (float)local_1480._4_4_ * auVar25._4_4_;
          local_1080._8_4_ =
               local_1500._4_4_ * auVar23._8_4_ +
               local_14e0._4_4_ * auVar24._8_4_ + (float)local_1480._4_4_ * auVar25._8_4_;
          local_1080._12_4_ =
               local_1500._4_4_ * auVar23._12_4_ +
               local_14e0._4_4_ * auVar24._12_4_ + (float)local_1480._4_4_ * auVar25._12_4_;
          local_1080._16_4_ =
               local_1500._4_4_ * auVar23._16_4_ +
               local_14e0._4_4_ * auVar24._16_4_ + (float)local_1480._4_4_ * auVar25._16_4_;
          local_1080._20_4_ =
               local_1500._4_4_ * auVar23._20_4_ +
               local_14e0._4_4_ * auVar24._20_4_ + (float)local_1480._4_4_ * auVar25._20_4_;
          local_1080._24_4_ =
               local_1500._4_4_ * auVar23._24_4_ +
               local_14e0._4_4_ * auVar24._24_4_ + (float)local_1480._4_4_ * auVar25._24_4_;
          local_1080._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar25._28_4_;
          auVar23 = vsubps_avx(local_13e0,auVar100);
          local_1060 = vsubps_avx(local_fe0,auVar19);
          fVar167 = fVar12 + auVar100._0_4_;
          fVar169 = fVar13 + auVar100._4_4_;
          fVar171 = fVar14 + auVar100._8_4_;
          fVar173 = fVar15 + auVar100._12_4_;
          fVar175 = fVar16 + auVar100._16_4_;
          fVar177 = fVar17 + auVar100._20_4_;
          fVar132 = fVar18 + auVar100._24_4_;
          fVar115 = auVar100._28_4_;
          fVar125 = fVar210 + auVar19._0_4_;
          fVar127 = fVar212 + auVar19._4_4_;
          fVar129 = fVar213 + auVar19._8_4_;
          fVar131 = fVar214 + auVar19._12_4_;
          fVar157 = fVar215 + auVar19._16_4_;
          fVar160 = fVar216 + auVar19._20_4_;
          fVar163 = fVar217 + auVar19._24_4_;
          fVar190 = local_1060._0_4_;
          fVar195 = local_1060._4_4_;
          auVar29._4_4_ = fVar195 * fVar169;
          auVar29._0_4_ = fVar190 * fVar167;
          fVar197 = local_1060._8_4_;
          auVar29._8_4_ = fVar197 * fVar171;
          fVar199 = local_1060._12_4_;
          auVar29._12_4_ = fVar199 * fVar173;
          fVar201 = local_1060._16_4_;
          auVar29._16_4_ = fVar201 * fVar175;
          fVar203 = local_1060._20_4_;
          auVar29._20_4_ = fVar203 * fVar177;
          fVar205 = local_1060._24_4_;
          auVar29._24_4_ = fVar205 * fVar132;
          auVar29._28_4_ = fVar170;
          fVar141 = auVar23._0_4_;
          fVar146 = auVar23._4_4_;
          auVar30._4_4_ = fVar146 * fVar127;
          auVar30._0_4_ = fVar141 * fVar125;
          fVar149 = auVar23._8_4_;
          auVar30._8_4_ = fVar149 * fVar129;
          fVar152 = auVar23._12_4_;
          auVar30._12_4_ = fVar152 * fVar131;
          fVar155 = auVar23._16_4_;
          auVar30._16_4_ = fVar155 * fVar157;
          fVar158 = auVar23._20_4_;
          auVar30._20_4_ = fVar158 * fVar160;
          fVar161 = auVar23._24_4_;
          auVar30._24_4_ = fVar161 * fVar163;
          auVar30._28_4_ = fVar77;
          auVar23 = vsubps_avx(auVar30,auVar29);
          auVar24 = vsubps_avx(local_13c0,auVar80);
          fVar121 = auVar24._0_4_;
          fVar123 = auVar24._4_4_;
          auVar31._4_4_ = fVar123 * fVar127;
          auVar31._0_4_ = fVar121 * fVar125;
          fVar125 = auVar24._8_4_;
          auVar31._8_4_ = fVar125 * fVar129;
          fVar127 = auVar24._12_4_;
          auVar31._12_4_ = fVar127 * fVar131;
          fVar129 = auVar24._16_4_;
          auVar31._16_4_ = fVar129 * fVar157;
          fVar131 = auVar24._20_4_;
          auVar31._20_4_ = fVar131 * fVar160;
          fVar157 = auVar24._24_4_;
          auVar31._24_4_ = fVar157 * fVar163;
          auVar31._28_4_ = fVar170 + auVar19._28_4_;
          fVar160 = fVar181 + auVar80._0_4_;
          fVar163 = fVar183 + auVar80._4_4_;
          fVar170 = fVar184 + auVar80._8_4_;
          fVar172 = fVar185 + auVar80._12_4_;
          fVar174 = fVar186 + auVar80._16_4_;
          fVar176 = fVar187 + auVar80._20_4_;
          fVar178 = fVar188 + auVar80._24_4_;
          auVar32._4_4_ = fVar195 * fVar163;
          auVar32._0_4_ = fVar190 * fVar160;
          auVar32._8_4_ = fVar197 * fVar170;
          auVar32._12_4_ = fVar199 * fVar172;
          auVar32._16_4_ = fVar201 * fVar174;
          auVar32._20_4_ = fVar203 * fVar176;
          auVar32._24_4_ = fVar205 * fVar178;
          auVar32._28_4_ = local_1060._28_4_;
          auVar24 = vsubps_avx(auVar32,auVar31);
          auVar33._4_4_ = fVar146 * fVar163;
          auVar33._0_4_ = fVar141 * fVar160;
          auVar33._8_4_ = fVar149 * fVar170;
          auVar33._12_4_ = fVar152 * fVar172;
          auVar33._16_4_ = fVar155 * fVar174;
          auVar33._20_4_ = fVar158 * fVar176;
          auVar33._24_4_ = fVar161 * fVar178;
          auVar33._28_4_ = local_13c0._28_4_ + auVar80._28_4_;
          auVar34._4_4_ = fVar123 * fVar169;
          auVar34._0_4_ = fVar121 * fVar167;
          auVar34._8_4_ = fVar125 * fVar171;
          auVar34._12_4_ = fVar127 * fVar173;
          auVar34._16_4_ = fVar129 * fVar175;
          auVar34._20_4_ = fVar131 * fVar177;
          auVar34._24_4_ = fVar157 * fVar132;
          auVar34._28_4_ = fVar77 + fVar115;
          auVar25 = vsubps_avx(auVar34,auVar33);
          local_10c0._0_4_ =
               local_1500._4_4_ * auVar23._0_4_ +
               local_14e0._4_4_ * auVar24._0_4_ + (float)local_1480._4_4_ * auVar25._0_4_;
          local_10c0._4_4_ =
               local_1500._4_4_ * auVar23._4_4_ +
               local_14e0._4_4_ * auVar24._4_4_ + (float)local_1480._4_4_ * auVar25._4_4_;
          local_10c0._8_4_ =
               local_1500._4_4_ * auVar23._8_4_ +
               local_14e0._4_4_ * auVar24._8_4_ + (float)local_1480._4_4_ * auVar25._8_4_;
          local_10c0._12_4_ =
               local_1500._4_4_ * auVar23._12_4_ +
               local_14e0._4_4_ * auVar24._12_4_ + (float)local_1480._4_4_ * auVar25._12_4_;
          local_10c0._16_4_ =
               local_1500._4_4_ * auVar23._16_4_ +
               local_14e0._4_4_ * auVar24._16_4_ + (float)local_1480._4_4_ * auVar25._16_4_;
          local_10c0._20_4_ =
               local_1500._4_4_ * auVar23._20_4_ +
               local_14e0._4_4_ * auVar24._20_4_ + (float)local_1480._4_4_ * auVar25._20_4_;
          local_10c0._24_4_ =
               local_1500._4_4_ * auVar23._24_4_ +
               local_14e0._4_4_ * auVar24._24_4_ + (float)local_1480._4_4_ * auVar25._24_4_;
          local_10c0._28_4_ = auVar23._28_4_ + auVar24._28_4_ + auVar25._28_4_;
          auVar24 = vsubps_avx(auVar80,auVar20);
          fVar77 = auVar80._0_4_ + auVar20._0_4_;
          fVar160 = auVar80._4_4_ + auVar20._4_4_;
          fVar163 = auVar80._8_4_ + auVar20._8_4_;
          fVar167 = auVar80._12_4_ + auVar20._12_4_;
          fVar169 = auVar80._16_4_ + auVar20._16_4_;
          fVar171 = auVar80._20_4_ + auVar20._20_4_;
          fVar173 = auVar80._24_4_ + auVar20._24_4_;
          auVar25 = vsubps_avx(auVar100,auVar21);
          fVar175 = auVar100._0_4_ + auVar21._0_4_;
          fVar177 = auVar100._4_4_ + auVar21._4_4_;
          fVar132 = auVar100._8_4_ + auVar21._8_4_;
          fVar170 = auVar100._12_4_ + auVar21._12_4_;
          fVar172 = auVar100._16_4_ + auVar21._16_4_;
          fVar174 = auVar100._20_4_ + auVar21._20_4_;
          fVar176 = auVar100._24_4_ + auVar21._24_4_;
          fVar178 = fVar115 + auVar21._28_4_;
          auVar100 = vsubps_avx(auVar19,auVar22);
          fVar94 = auVar19._0_4_ + auVar22._0_4_;
          fVar106 = auVar19._4_4_ + auVar22._4_4_;
          fVar107 = auVar19._8_4_ + auVar22._8_4_;
          fVar108 = auVar19._12_4_ + auVar22._12_4_;
          fVar109 = auVar19._16_4_ + auVar22._16_4_;
          fVar110 = auVar19._20_4_ + auVar22._20_4_;
          fVar111 = auVar19._24_4_ + auVar22._24_4_;
          fVar116 = auVar100._0_4_;
          fVar122 = auVar100._4_4_;
          auVar21._4_4_ = fVar122 * fVar177;
          auVar21._0_4_ = fVar116 * fVar175;
          fVar124 = auVar100._8_4_;
          auVar21._8_4_ = fVar124 * fVar132;
          fVar126 = auVar100._12_4_;
          auVar21._12_4_ = fVar126 * fVar170;
          fVar128 = auVar100._16_4_;
          auVar21._16_4_ = fVar128 * fVar172;
          fVar130 = auVar100._20_4_;
          auVar21._20_4_ = fVar130 * fVar174;
          fVar133 = auVar100._24_4_;
          auVar21._24_4_ = fVar133 * fVar176;
          auVar21._28_4_ = auVar23._28_4_;
          fVar142 = auVar25._0_4_;
          fVar147 = auVar25._4_4_;
          auVar35._4_4_ = fVar147 * fVar106;
          auVar35._0_4_ = fVar142 * fVar94;
          fVar150 = auVar25._8_4_;
          auVar35._8_4_ = fVar150 * fVar107;
          fVar153 = auVar25._12_4_;
          auVar35._12_4_ = fVar153 * fVar108;
          fVar156 = auVar25._16_4_;
          auVar35._16_4_ = fVar156 * fVar109;
          fVar159 = auVar25._20_4_;
          auVar35._20_4_ = fVar159 * fVar110;
          fVar162 = auVar25._24_4_;
          auVar35._24_4_ = fVar162 * fVar111;
          auVar35._28_4_ = fVar115;
          auVar100 = vsubps_avx(auVar35,auVar21);
          fVar164 = auVar24._0_4_;
          fVar168 = auVar24._4_4_;
          auVar36._4_4_ = fVar168 * fVar106;
          auVar36._0_4_ = fVar164 * fVar94;
          fVar94 = auVar24._8_4_;
          auVar36._8_4_ = fVar94 * fVar107;
          fVar106 = auVar24._12_4_;
          auVar36._12_4_ = fVar106 * fVar108;
          fVar107 = auVar24._16_4_;
          auVar36._16_4_ = fVar107 * fVar109;
          fVar108 = auVar24._20_4_;
          auVar36._20_4_ = fVar108 * fVar110;
          fVar109 = auVar24._24_4_;
          auVar36._24_4_ = fVar109 * fVar111;
          auVar36._28_4_ = auVar19._28_4_ + auVar22._28_4_;
          auVar19._4_4_ = fVar122 * fVar160;
          auVar19._0_4_ = fVar116 * fVar77;
          auVar19._8_4_ = fVar124 * fVar163;
          auVar19._12_4_ = fVar126 * fVar167;
          auVar19._16_4_ = fVar128 * fVar169;
          auVar19._20_4_ = fVar130 * fVar171;
          auVar19._24_4_ = fVar133 * fVar173;
          auVar19._28_4_ = fVar115;
          auVar19 = vsubps_avx(auVar19,auVar36);
          auVar22._4_4_ = fVar147 * fVar160;
          auVar22._0_4_ = fVar142 * fVar77;
          auVar22._8_4_ = fVar150 * fVar163;
          auVar22._12_4_ = fVar153 * fVar167;
          auVar22._16_4_ = fVar156 * fVar169;
          auVar22._20_4_ = fVar159 * fVar171;
          auVar22._24_4_ = fVar162 * fVar173;
          auVar22._28_4_ = auVar80._28_4_ + auVar20._28_4_;
          auVar20._4_4_ = fVar168 * fVar177;
          auVar20._0_4_ = fVar164 * fVar175;
          auVar20._8_4_ = fVar94 * fVar132;
          auVar20._12_4_ = fVar106 * fVar170;
          auVar20._16_4_ = fVar107 * fVar172;
          auVar20._20_4_ = fVar108 * fVar174;
          auVar20._24_4_ = fVar109 * fVar176;
          auVar20._28_4_ = fVar178;
          auVar80 = vsubps_avx(auVar20,auVar22);
          local_1480._0_4_ = local_1480._4_4_;
          fStack_1478 = (float)local_1480._4_4_;
          fStack_1474 = (float)local_1480._4_4_;
          fStack_1470 = (float)local_1480._4_4_;
          fStack_146c = (float)local_1480._4_4_;
          fStack_1468 = (float)local_1480._4_4_;
          fStack_1464 = (float)local_1480._4_4_;
          local_14e0._0_4_ = local_14e0._4_4_;
          fStack_14d8 = local_14e0._4_4_;
          fStack_14d4 = local_14e0._4_4_;
          fStack_14d0 = local_14e0._4_4_;
          fStack_14cc = local_14e0._4_4_;
          fStack_14c8 = local_14e0._4_4_;
          fStack_14c4 = local_14e0._4_4_;
          local_1500._0_4_ = local_1500._4_4_;
          fStack_14f8 = local_1500._4_4_;
          fStack_14f4 = local_1500._4_4_;
          fStack_14f0 = local_1500._4_4_;
          fStack_14ec = local_1500._4_4_;
          fStack_14e8 = local_1500._4_4_;
          fStack_14e4 = local_1500._4_4_;
          auVar82._0_4_ =
               local_1500._4_4_ * auVar100._0_4_ +
               local_14e0._4_4_ * auVar19._0_4_ + (float)local_1480._4_4_ * auVar80._0_4_;
          auVar82._4_4_ =
               local_1500._4_4_ * auVar100._4_4_ +
               local_14e0._4_4_ * auVar19._4_4_ + (float)local_1480._4_4_ * auVar80._4_4_;
          auVar82._8_4_ =
               local_1500._4_4_ * auVar100._8_4_ +
               local_14e0._4_4_ * auVar19._8_4_ + (float)local_1480._4_4_ * auVar80._8_4_;
          auVar82._12_4_ =
               local_1500._4_4_ * auVar100._12_4_ +
               local_14e0._4_4_ * auVar19._12_4_ + (float)local_1480._4_4_ * auVar80._12_4_;
          auVar82._16_4_ =
               local_1500._4_4_ * auVar100._16_4_ +
               local_14e0._4_4_ * auVar19._16_4_ + (float)local_1480._4_4_ * auVar80._16_4_;
          auVar82._20_4_ =
               local_1500._4_4_ * auVar100._20_4_ +
               local_14e0._4_4_ * auVar19._20_4_ + (float)local_1480._4_4_ * auVar80._20_4_;
          auVar82._24_4_ =
               local_1500._4_4_ * auVar100._24_4_ +
               local_14e0._4_4_ * auVar19._24_4_ + (float)local_1480._4_4_ * auVar80._24_4_;
          auVar82._28_4_ = fVar178 + fVar178 + auVar80._28_4_;
          local_10e0._0_4_ = auVar82._0_4_ + local_1080._0_4_ + local_10c0._0_4_;
          local_10e0._4_4_ = auVar82._4_4_ + local_1080._4_4_ + local_10c0._4_4_;
          local_10e0._8_4_ = auVar82._8_4_ + local_1080._8_4_ + local_10c0._8_4_;
          local_10e0._12_4_ = auVar82._12_4_ + local_1080._12_4_ + local_10c0._12_4_;
          local_10e0._16_4_ = auVar82._16_4_ + local_1080._16_4_ + local_10c0._16_4_;
          local_10e0._20_4_ = auVar82._20_4_ + local_1080._20_4_ + local_10c0._20_4_;
          local_10e0._24_4_ = auVar82._24_4_ + local_1080._24_4_ + local_10c0._24_4_;
          local_10e0._28_4_ = auVar82._28_4_ + local_1080._28_4_ + local_10c0._28_4_;
          auVar80 = vminps_avx(local_1080,local_10c0);
          auVar80 = vminps_avx(auVar80,auVar82);
          auVar102._8_4_ = 0x7fffffff;
          auVar102._0_8_ = 0x7fffffff7fffffff;
          auVar102._12_4_ = 0x7fffffff;
          auVar102._16_4_ = 0x7fffffff;
          auVar102._20_4_ = 0x7fffffff;
          auVar102._24_4_ = 0x7fffffff;
          auVar102._28_4_ = 0x7fffffff;
          local_10a0 = vandps_avx(local_10e0,auVar102);
          fVar77 = local_10a0._0_4_ * 1.1920929e-07;
          fVar115 = local_10a0._4_4_ * 1.1920929e-07;
          auVar37._4_4_ = fVar115;
          auVar37._0_4_ = fVar77;
          fVar160 = local_10a0._8_4_ * 1.1920929e-07;
          auVar37._8_4_ = fVar160;
          fVar163 = local_10a0._12_4_ * 1.1920929e-07;
          auVar37._12_4_ = fVar163;
          fVar167 = local_10a0._16_4_ * 1.1920929e-07;
          auVar37._16_4_ = fVar167;
          fVar169 = local_10a0._20_4_ * 1.1920929e-07;
          auVar37._20_4_ = fVar169;
          fVar171 = local_10a0._24_4_ * 1.1920929e-07;
          auVar37._24_4_ = fVar171;
          auVar37._28_4_ = 0x34000000;
          auVar113._0_8_ = CONCAT44(fVar115,fVar77) ^ 0x8000000080000000;
          auVar113._8_4_ = -fVar160;
          auVar113._12_4_ = -fVar163;
          auVar113._16_4_ = -fVar167;
          auVar113._20_4_ = -fVar169;
          auVar113._24_4_ = -fVar171;
          auVar113._28_4_ = 0xb4000000;
          auVar80 = vcmpps_avx(auVar80,auVar113,5);
          auVar19 = vmaxps_avx(local_1080,local_10c0);
          auVar100 = vmaxps_avx(auVar19,auVar82);
          auVar100 = vcmpps_avx(auVar100,auVar37,2);
          auVar100 = vorps_avx(auVar80,auVar100);
          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar100 >> 0x7f,0) != '\0') ||
                (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0xbf,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar100[0x1f] < '\0') {
            auVar38._4_4_ = fVar146 * fVar71;
            auVar38._0_4_ = fVar141 * fVar66;
            auVar38._8_4_ = fVar149 * fVar72;
            auVar38._12_4_ = fVar152 * fVar73;
            auVar38._16_4_ = fVar155 * fVar74;
            auVar38._20_4_ = fVar158 * fVar75;
            auVar38._24_4_ = fVar161 * fVar76;
            auVar38._28_4_ = auVar80._28_4_;
            auVar39._4_4_ = fVar194 * fVar195;
            auVar39._0_4_ = fVar189 * fVar190;
            auVar39._8_4_ = fVar196 * fVar197;
            auVar39._12_4_ = fVar198 * fVar199;
            auVar39._16_4_ = fVar200 * fVar201;
            auVar39._20_4_ = fVar202 * fVar203;
            auVar39._24_4_ = fVar204 * fVar205;
            auVar39._28_4_ = 0x34000000;
            auVar20 = vsubps_avx(auVar39,auVar38);
            auVar40._4_4_ = fVar147 * fVar195;
            auVar40._0_4_ = fVar142 * fVar190;
            auVar40._8_4_ = fVar150 * fVar197;
            auVar40._12_4_ = fVar153 * fVar199;
            auVar40._16_4_ = fVar156 * fVar201;
            auVar40._20_4_ = fVar159 * fVar203;
            auVar40._24_4_ = fVar162 * fVar205;
            auVar40._28_4_ = auVar19._28_4_;
            auVar41._4_4_ = fVar146 * fVar122;
            auVar41._0_4_ = fVar141 * fVar116;
            auVar41._8_4_ = fVar149 * fVar124;
            auVar41._12_4_ = fVar152 * fVar126;
            auVar41._16_4_ = fVar155 * fVar128;
            auVar41._20_4_ = fVar158 * fVar130;
            auVar41._24_4_ = fVar161 * fVar133;
            auVar41._28_4_ = auVar24._28_4_;
            auVar21 = vsubps_avx(auVar41,auVar40);
            auVar192._8_4_ = 0x7fffffff;
            auVar192._0_8_ = 0x7fffffff7fffffff;
            auVar192._12_4_ = 0x7fffffff;
            auVar192._16_4_ = 0x7fffffff;
            auVar192._20_4_ = 0x7fffffff;
            auVar192._24_4_ = 0x7fffffff;
            auVar192._28_4_ = 0x7fffffff;
            auVar80 = vandps_avx(auVar192,auVar38);
            auVar19 = vandps_avx(auVar192,auVar40);
            auVar80 = vcmpps_avx(auVar80,auVar19,1);
            local_1280 = vblendvps_avx(auVar21,auVar20,auVar80);
            auVar42._4_4_ = fVar123 * fVar122;
            auVar42._0_4_ = fVar121 * fVar116;
            auVar42._8_4_ = fVar125 * fVar124;
            auVar42._12_4_ = fVar127 * fVar126;
            auVar42._16_4_ = fVar129 * fVar128;
            auVar42._20_4_ = fVar131 * fVar130;
            auVar42._24_4_ = fVar157 * fVar133;
            auVar42._28_4_ = auVar80._28_4_;
            auVar43._4_4_ = fVar123 * fVar71;
            auVar43._0_4_ = fVar121 * fVar66;
            auVar43._8_4_ = fVar125 * fVar72;
            auVar43._12_4_ = fVar127 * fVar73;
            auVar43._16_4_ = fVar129 * fVar74;
            auVar43._20_4_ = fVar131 * fVar75;
            auVar43._24_4_ = fVar157 * fVar76;
            auVar43._28_4_ = auVar20._28_4_;
            auVar44._4_4_ = fVar86 * fVar195;
            auVar44._0_4_ = fVar85 * fVar190;
            auVar44._8_4_ = fVar140 * fVar197;
            auVar44._12_4_ = fVar145 * fVar199;
            auVar44._16_4_ = fVar148 * fVar201;
            auVar44._20_4_ = fVar151 * fVar203;
            auVar44._24_4_ = fVar154 * fVar205;
            auVar44._28_4_ = auVar19._28_4_;
            auVar20 = vsubps_avx(auVar43,auVar44);
            auVar45._4_4_ = fVar195 * fVar168;
            auVar45._0_4_ = fVar190 * fVar164;
            auVar45._8_4_ = fVar197 * fVar94;
            auVar45._12_4_ = fVar199 * fVar106;
            auVar45._16_4_ = fVar201 * fVar107;
            auVar45._20_4_ = fVar203 * fVar108;
            auVar45._24_4_ = fVar205 * fVar109;
            auVar45._28_4_ = local_1060._28_4_;
            auVar21 = vsubps_avx(auVar45,auVar42);
            auVar80 = vandps_avx(auVar192,auVar44);
            auVar19 = vandps_avx(auVar192,auVar42);
            auVar19 = vcmpps_avx(auVar80,auVar19,1);
            local_1260 = vblendvps_avx(auVar21,auVar20,auVar19);
            auVar46._4_4_ = fVar146 * fVar168;
            auVar46._0_4_ = fVar141 * fVar164;
            auVar46._8_4_ = fVar149 * fVar94;
            auVar46._12_4_ = fVar152 * fVar106;
            auVar46._16_4_ = fVar155 * fVar107;
            auVar46._20_4_ = fVar158 * fVar108;
            auVar46._24_4_ = fVar161 * fVar109;
            auVar46._28_4_ = auVar19._28_4_;
            auVar47._4_4_ = fVar86 * fVar146;
            auVar47._0_4_ = fVar85 * fVar141;
            auVar47._8_4_ = fVar140 * fVar149;
            auVar47._12_4_ = fVar145 * fVar152;
            auVar47._16_4_ = fVar148 * fVar155;
            auVar47._20_4_ = fVar151 * fVar158;
            auVar47._24_4_ = fVar154 * fVar161;
            auVar47._28_4_ = auVar20._28_4_;
            auVar48._4_4_ = fVar194 * fVar123;
            auVar48._0_4_ = fVar189 * fVar121;
            auVar48._8_4_ = fVar196 * fVar125;
            auVar48._12_4_ = fVar198 * fVar127;
            auVar48._16_4_ = fVar200 * fVar129;
            auVar48._20_4_ = fVar202 * fVar131;
            auVar48._24_4_ = fVar204 * fVar157;
            auVar48._28_4_ = auVar80._28_4_;
            auVar49._4_4_ = fVar123 * fVar147;
            auVar49._0_4_ = fVar121 * fVar142;
            auVar49._8_4_ = fVar125 * fVar150;
            auVar49._12_4_ = fVar127 * fVar153;
            auVar49._16_4_ = fVar129 * fVar156;
            auVar49._20_4_ = fVar131 * fVar159;
            auVar49._24_4_ = fVar157 * fVar162;
            auVar49._28_4_ = local_1040._28_4_;
            auVar20 = vsubps_avx(auVar47,auVar48);
            auVar21 = vsubps_avx(auVar49,auVar46);
            auVar80 = vandps_avx(auVar48,auVar192);
            auVar19 = vandps_avx(auVar46,auVar192);
            auVar80 = vcmpps_avx(auVar80,auVar19,1);
            local_1240 = vblendvps_avx(auVar21,auVar20,auVar80);
            auVar67 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
            fVar154 = local_1240._0_4_;
            fVar66 = local_1240._4_4_;
            fVar121 = local_1240._8_4_;
            fVar71 = local_1240._12_4_;
            fVar123 = local_1240._16_4_;
            fVar72 = local_1240._20_4_;
            fVar125 = local_1240._24_4_;
            fVar157 = local_1260._0_4_;
            fVar160 = local_1260._4_4_;
            fVar163 = local_1260._8_4_;
            fVar167 = local_1260._12_4_;
            fVar169 = local_1260._16_4_;
            fVar171 = local_1260._20_4_;
            fVar173 = local_1260._24_4_;
            fVar73 = local_1280._0_4_;
            fVar127 = local_1280._4_4_;
            fVar74 = local_1280._8_4_;
            fVar129 = local_1280._12_4_;
            fVar75 = local_1280._16_4_;
            fVar131 = local_1280._20_4_;
            fVar76 = local_1280._24_4_;
            fVar77 = fVar73 * local_1500._4_4_ +
                     fVar157 * local_14e0._4_4_ + fVar154 * (float)local_1480._4_4_;
            fVar115 = fVar127 * local_1500._4_4_ +
                      fVar160 * local_14e0._4_4_ + fVar66 * (float)local_1480._4_4_;
            fVar85 = fVar74 * local_1500._4_4_ +
                     fVar163 * local_14e0._4_4_ + fVar121 * (float)local_1480._4_4_;
            fVar86 = fVar129 * local_1500._4_4_ +
                     fVar167 * local_14e0._4_4_ + fVar71 * (float)local_1480._4_4_;
            fVar140 = fVar75 * local_1500._4_4_ +
                      fVar169 * local_14e0._4_4_ + fVar123 * (float)local_1480._4_4_;
            fVar145 = fVar131 * local_1500._4_4_ +
                      fVar171 * local_14e0._4_4_ + fVar72 * (float)local_1480._4_4_;
            fVar148 = fVar76 * local_1500._4_4_ +
                      fVar173 * local_14e0._4_4_ + fVar125 * (float)local_1480._4_4_;
            fVar151 = auVar80._28_4_ + auVar80._28_4_ + auVar24._28_4_;
            auVar83._0_4_ = fVar77 + fVar77;
            auVar83._4_4_ = fVar115 + fVar115;
            auVar83._8_4_ = fVar85 + fVar85;
            auVar83._12_4_ = fVar86 + fVar86;
            auVar83._16_4_ = fVar140 + fVar140;
            auVar83._20_4_ = fVar145 + fVar145;
            auVar83._24_4_ = fVar148 + fVar148;
            auVar83._28_4_ = fVar151 + fVar151;
            auVar80 = vrcpps_avx(auVar83);
            fVar77 = fVar73 * fVar181 + fVar157 * fVar12 + fVar154 * fVar210;
            fVar115 = fVar127 * fVar183 + fVar160 * fVar13 + fVar66 * fVar212;
            fVar85 = fVar74 * fVar184 + fVar163 * fVar14 + fVar121 * fVar213;
            fVar86 = fVar129 * fVar185 + fVar167 * fVar15 + fVar71 * fVar214;
            fVar140 = fVar75 * fVar186 + fVar169 * fVar16 + fVar123 * fVar215;
            fVar145 = fVar131 * fVar187 + fVar171 * fVar17 + fVar72 * fVar216;
            fVar148 = fVar76 * fVar188 + fVar173 * fVar18 + fVar125 * fVar217;
            fVar12 = auVar80._0_4_;
            fVar13 = auVar80._4_4_;
            auVar50._4_4_ = auVar83._4_4_ * fVar13;
            auVar50._0_4_ = auVar83._0_4_ * fVar12;
            fVar14 = auVar80._8_4_;
            auVar50._8_4_ = auVar83._8_4_ * fVar14;
            fVar15 = auVar80._12_4_;
            auVar50._12_4_ = auVar83._12_4_ * fVar15;
            fVar16 = auVar80._16_4_;
            auVar50._16_4_ = auVar83._16_4_ * fVar16;
            fVar17 = auVar80._20_4_;
            auVar50._20_4_ = auVar83._20_4_ * fVar17;
            fVar18 = auVar80._24_4_;
            auVar50._24_4_ = auVar83._24_4_ * fVar18;
            auVar50._28_4_ = auVar20._28_4_;
            auVar135._8_4_ = 0x3f800000;
            auVar135._0_8_ = 0x3f8000003f800000;
            auVar135._12_4_ = 0x3f800000;
            auVar135._16_4_ = 0x3f800000;
            auVar135._20_4_ = 0x3f800000;
            auVar135._24_4_ = 0x3f800000;
            auVar135._28_4_ = 0x3f800000;
            auVar80 = vsubps_avx(auVar135,auVar50);
            uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar114._4_4_ = uVar1;
            auVar114._0_4_ = uVar1;
            auVar114._8_4_ = uVar1;
            auVar114._12_4_ = uVar1;
            auVar114._16_4_ = uVar1;
            auVar114._20_4_ = uVar1;
            auVar114._24_4_ = uVar1;
            auVar114._28_4_ = uVar1;
            local_11c0._4_4_ = (fVar115 + fVar115) * (fVar13 + fVar13 * auVar80._4_4_);
            local_11c0._0_4_ = (fVar77 + fVar77) * (fVar12 + fVar12 * auVar80._0_4_);
            local_11c0._8_4_ = (fVar85 + fVar85) * (fVar14 + fVar14 * auVar80._8_4_);
            local_11c0._12_4_ = (fVar86 + fVar86) * (fVar15 + fVar15 * auVar80._12_4_);
            local_11c0._16_4_ = (fVar140 + fVar140) * (fVar16 + fVar16 * auVar80._16_4_);
            local_11c0._20_4_ = (fVar145 + fVar145) * (fVar17 + fVar17 * auVar80._20_4_);
            local_11c0._24_4_ = (fVar148 + fVar148) * (fVar18 + fVar18 * auVar80._24_4_);
            local_11c0._28_4_ = auVar25._28_4_;
            auVar70 = ZEXT3264(local_11c0);
            auVar80 = vcmpps_avx(auVar114,local_11c0,2);
            fVar12 = (ray->super_RayK<1>).tfar;
            auVar103._4_4_ = fVar12;
            auVar103._0_4_ = fVar12;
            auVar103._8_4_ = fVar12;
            auVar103._12_4_ = fVar12;
            auVar103._16_4_ = fVar12;
            auVar103._20_4_ = fVar12;
            auVar103._24_4_ = fVar12;
            auVar103._28_4_ = fVar12;
            auVar100 = vcmpps_avx(local_11c0,auVar103,2);
            auVar80 = vandps_avx(auVar100,auVar80);
            auVar19 = vcmpps_avx(auVar83,_DAT_01f7b000,4);
            auVar80 = vandps_avx(auVar80,auVar19);
            auVar99 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
            auVar67 = vpand_avx(auVar99,auVar67);
            auVar99 = vpmovsxwd_avx(auVar67);
            auVar78 = vpshufd_avx(auVar67,0xee);
            auVar78 = vpmovsxwd_avx(auVar78);
            local_1220._16_16_ = auVar78;
            local_1220._0_16_ = auVar99;
            if ((((((((local_1220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1220 >> 0x7f,0) != '\0') ||
                  (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar78 >> 0x3f,0) != '\0') ||
                (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar78[0xf] < '\0') {
              local_12e0 = local_1080;
              local_12c0 = local_10c0;
              local_12a0 = local_10e0;
              auVar80 = vrcpps_avx(local_10e0);
              fVar12 = auVar80._0_4_;
              fVar13 = auVar80._4_4_;
              auVar51._4_4_ = local_10e0._4_4_ * fVar13;
              auVar51._0_4_ = local_10e0._0_4_ * fVar12;
              fVar14 = auVar80._8_4_;
              auVar51._8_4_ = local_10e0._8_4_ * fVar14;
              fVar15 = auVar80._12_4_;
              auVar51._12_4_ = local_10e0._12_4_ * fVar15;
              fVar16 = auVar80._16_4_;
              auVar51._16_4_ = local_10e0._16_4_ * fVar16;
              fVar17 = auVar80._20_4_;
              auVar51._20_4_ = local_10e0._20_4_ * fVar17;
              fVar18 = auVar80._24_4_;
              auVar51._24_4_ = local_10e0._24_4_ * fVar18;
              auVar51._28_4_ = auVar100._28_4_;
              auVar138._8_4_ = 0x3f800000;
              auVar138._0_8_ = 0x3f8000003f800000;
              auVar138._12_4_ = 0x3f800000;
              auVar138._16_4_ = 0x3f800000;
              auVar138._20_4_ = 0x3f800000;
              auVar138._24_4_ = 0x3f800000;
              auVar138._28_4_ = 0x3f800000;
              auVar100 = vsubps_avx(auVar138,auVar51);
              auVar92._0_4_ = fVar12 + fVar12 * auVar100._0_4_;
              auVar92._4_4_ = fVar13 + fVar13 * auVar100._4_4_;
              auVar92._8_4_ = fVar14 + fVar14 * auVar100._8_4_;
              auVar92._12_4_ = fVar15 + fVar15 * auVar100._12_4_;
              auVar92._16_4_ = fVar16 + fVar16 * auVar100._16_4_;
              auVar92._20_4_ = fVar17 + fVar17 * auVar100._20_4_;
              auVar92._24_4_ = fVar18 + fVar18 * auVar100._24_4_;
              auVar92._28_4_ = auVar80._28_4_ + auVar100._28_4_;
              auVar104._8_4_ = 0x219392ef;
              auVar104._0_8_ = 0x219392ef219392ef;
              auVar104._12_4_ = 0x219392ef;
              auVar104._16_4_ = 0x219392ef;
              auVar104._20_4_ = 0x219392ef;
              auVar104._24_4_ = 0x219392ef;
              auVar104._28_4_ = 0x219392ef;
              auVar100 = vcmpps_avx(local_10a0,auVar104,5);
              auVar80 = vandps_avx(auVar100,auVar92);
              local_1140 = local_1100;
              auVar52._4_4_ = local_1080._4_4_ * auVar80._4_4_;
              auVar52._0_4_ = local_1080._0_4_ * auVar80._0_4_;
              auVar52._8_4_ = local_1080._8_4_ * auVar80._8_4_;
              auVar52._12_4_ = local_1080._12_4_ * auVar80._12_4_;
              auVar52._16_4_ = local_1080._16_4_ * auVar80._16_4_;
              auVar52._20_4_ = local_1080._20_4_ * auVar80._20_4_;
              auVar52._24_4_ = local_1080._24_4_ * auVar80._24_4_;
              auVar52._28_4_ = auVar100._28_4_;
              auVar100 = vminps_avx(auVar52,auVar138);
              auVar53._4_4_ = local_10c0._4_4_ * auVar80._4_4_;
              auVar53._0_4_ = local_10c0._0_4_ * auVar80._0_4_;
              auVar53._8_4_ = local_10c0._8_4_ * auVar80._8_4_;
              auVar53._12_4_ = local_10c0._12_4_ * auVar80._12_4_;
              auVar53._16_4_ = local_10c0._16_4_ * auVar80._16_4_;
              auVar53._20_4_ = local_10c0._20_4_ * auVar80._20_4_;
              auVar53._24_4_ = local_10c0._24_4_ * auVar80._24_4_;
              auVar53._28_4_ = auVar80._28_4_;
              auVar80 = vminps_avx(auVar53,auVar138);
              auVar19 = vsubps_avx(auVar138,auVar100);
              local_11e0 = vblendvps_avx(auVar80,auVar19,local_1100);
              auVar80 = vsubps_avx(auVar138,auVar80);
              local_1200 = vblendvps_avx(auVar100,auVar80,local_1100);
              local_11a0[0] = fVar73 * (float)local_1120._0_4_;
              local_11a0[1] = fVar127 * (float)local_1120._4_4_;
              local_11a0[2] = fVar74 * fStack_1118;
              local_11a0[3] = fVar129 * fStack_1114;
              fStack_1190 = fVar75 * fStack_1110;
              fStack_118c = fVar131 * fStack_110c;
              fStack_1188 = fVar76 * fStack_1108;
              uStack_1184 = local_1200._28_4_;
              local_1180[0] = fVar157 * (float)local_1120._0_4_;
              local_1180[1] = fVar160 * (float)local_1120._4_4_;
              local_1180[2] = fVar163 * fStack_1118;
              local_1180[3] = fVar167 * fStack_1114;
              fStack_1170 = fVar169 * fStack_1110;
              fStack_116c = fVar171 * fStack_110c;
              fStack_1168 = fVar173 * fStack_1108;
              uStack_1164 = auVar100._28_4_;
              local_1160[0] = (float)local_1120._0_4_ * fVar154;
              local_1160[1] = (float)local_1120._4_4_ * fVar66;
              local_1160[2] = fStack_1118 * fVar121;
              local_1160[3] = fStack_1114 * fVar71;
              fStack_1150 = fStack_1110 * fVar123;
              fStack_114c = fStack_110c * fVar72;
              fStack_1148 = fStack_1108 * fVar125;
              uStack_1144 = uStack_1104;
              auVar99 = vpmovzxwd_avx(auVar67);
              auVar93._0_16_ = vpslld_avx(auVar99,0x1f);
              auVar99 = vpunpckhwd_avx(auVar67,auVar67);
              auVar99 = vpslld_avx(auVar99,0x1f);
              auVar93._16_16_ = auVar99;
              auVar105._8_4_ = 0x7f800000;
              auVar105._0_8_ = 0x7f8000007f800000;
              auVar105._12_4_ = 0x7f800000;
              auVar105._16_4_ = 0x7f800000;
              auVar105._20_4_ = 0x7f800000;
              auVar105._24_4_ = 0x7f800000;
              auVar105._28_4_ = 0x7f800000;
              auVar80 = vblendvps_avx(auVar105,local_11c0,auVar93);
              auVar100 = vshufps_avx(auVar80,auVar80,0xb1);
              auVar100 = vminps_avx(auVar80,auVar100);
              auVar19 = vshufpd_avx(auVar100,auVar100,5);
              auVar100 = vminps_avx(auVar100,auVar19);
              auVar19 = vperm2f128_avx(auVar100,auVar100,1);
              auVar100 = vminps_avx(auVar100,auVar19);
              auVar80 = vcmpps_avx(auVar80,auVar100,0);
              auVar99 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
              auVar67 = vpand_avx(auVar99,auVar67);
              auVar99 = vpmovzxwd_avx(auVar67);
              auVar99 = vpslld_avx(auVar99,0x1f);
              auVar99 = vpsrad_avx(auVar99,0x1f);
              auVar67 = vpunpckhwd_avx(auVar67,auVar67);
              auVar67 = vpslld_avx(auVar67,0x1f);
              auVar67 = vpsrad_avx(auVar67,0x1f);
              auVar68._16_16_ = auVar67;
              auVar68._0_16_ = auVar99;
              auVar80 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar136 = ZEXT3264(auVar80);
              local_1420 = local_1220;
              if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar68 >> 0x7f,0) == '\0') &&
                    (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar67 >> 0x3f,0) == '\0') &&
                  (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar67[0xf]) {
                auVar68 = local_1220;
              }
              uVar55 = vextractps_avx(auVar80._0_16_,1);
              uVar57 = vmovmskps_avx(auVar68);
              uVar58 = 0;
              local_1040 = auVar81;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                }
              }
LAB_00b78734:
              uVar64 = CONCAT44(0,uVar58);
              local_1438 = *(uint *)((long)&local_fc0 + uVar64 * 4);
              pGVar10 = (pSVar4->geometries).items[local_1438].ptr;
              if ((pGVar10->mask & uVar55) == 0) {
                *(undefined4 *)(local_1420 + uVar64 * 4) = 0;
              }
              else {
                local_14e0 = (byte *)context->args;
                local_13e0 = auVar136._0_32_;
                if (context->args->filter == (RTCFilterFunctionN)0x0) {
                  local_14b0.context = context->user;
                  if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar12 = *(float *)(local_1200 + uVar64 * 4);
                    fVar13 = *(float *)(local_11e0 + uVar64 * 4);
                    (ray->super_RayK<1>).tfar = local_11a0[uVar64 - 8];
                    (ray->Ng).field_0.field_0.x = local_11a0[uVar64];
                    (ray->Ng).field_0.field_0.y = local_1180[uVar64];
                    (ray->Ng).field_0.field_0.z = local_1160[uVar64];
                    ray->u = fVar12;
                    ray->v = fVar13;
                    ray->primID = *(uint *)((long)&local_1300 + uVar64 * 4);
                    ray->geomID = local_1438;
                    ray->instID[0] = (local_14b0.context)->instID[0];
                    ray->instPrimID[0] = (local_14b0.context)->instPrimID[0];
                    goto LAB_00b78ab6;
                  }
                }
                else {
                  local_14b0.context = context->user;
                }
                local_1450 = local_11a0[uVar64];
                local_144c = local_1180[uVar64];
                local_1448 = local_1160[uVar64];
                local_1444 = *(undefined4 *)(local_1200 + uVar64 * 4);
                local_1440 = *(undefined4 *)(local_11e0 + uVar64 * 4);
                local_143c = *(undefined4 *)((long)&local_1300 + uVar64 * 4);
                local_1434 = (local_14b0.context)->instID[0];
                local_1430 = (local_14b0.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = local_11a0[uVar64 - 8];
                local_151c = -1;
                local_14b0.valid = &local_151c;
                local_14b0.geometryUserPtr = pGVar10->userPtr;
                local_14b0.ray = (RTCRayN *)ray;
                local_14b0.hit = (RTCHitN *)&local_1450;
                local_14b0.N = 1;
                local_1500 = (long)pGVar10;
                _local_1480 = auVar70._0_32_;
                local_13c0._0_8_ = uVar64;
                if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b7893b:
                  if ((*(code **)(local_14e0 + 0x10) != (code *)0x0) &&
                     (((*local_14e0 & 2) != 0 || ((*(byte *)(local_1500 + 0x3e) & 0x40) != 0)))) {
                    (**(code **)(local_14e0 + 0x10))(&local_14b0);
                    auVar70 = ZEXT3264(_local_1480);
                    uVar64 = local_13c0._0_8_;
                    context = local_1508;
                    ray = local_1510;
                    uVar61 = local_1518;
                    if (*local_14b0.valid == 0) goto LAB_00b789fd;
                  }
                  (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_14b0.hit;
                  (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_14b0.hit + 4);
                  (((Vec3f *)((long)local_14b0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_14b0.hit + 8);
                  *(float *)((long)local_14b0.ray + 0x3c) = *(float *)(local_14b0.hit + 0xc);
                  *(float *)((long)local_14b0.ray + 0x40) = *(float *)(local_14b0.hit + 0x10);
                  *(float *)((long)local_14b0.ray + 0x44) = *(float *)(local_14b0.hit + 0x14);
                  *(float *)((long)local_14b0.ray + 0x48) = *(float *)(local_14b0.hit + 0x18);
                  *(float *)((long)local_14b0.ray + 0x4c) = *(float *)(local_14b0.hit + 0x1c);
                  *(float *)((long)local_14b0.ray + 0x50) = *(float *)(local_14b0.hit + 0x20);
                }
                else {
                  (*pGVar10->intersectionFilterN)(&local_14b0);
                  auVar70 = ZEXT3264(_local_1480);
                  uVar64 = local_13c0._0_8_;
                  context = local_1508;
                  ray = local_1510;
                  uVar61 = local_1518;
                  if (*local_14b0.valid != 0) goto LAB_00b7893b;
LAB_00b789fd:
                  (local_1510->super_RayK<1>).tfar = (float)local_13e0._0_4_;
                  uVar64 = local_13c0._0_8_;
                  context = local_1508;
                  ray = local_1510;
                  uVar61 = local_1518;
                }
                *(undefined4 *)(local_1420 + uVar64 * 4) = 0;
                fVar12 = (ray->super_RayK<1>).tfar;
                auVar69._4_4_ = fVar12;
                auVar69._0_4_ = fVar12;
                auVar69._8_4_ = fVar12;
                auVar69._12_4_ = fVar12;
                auVar69._16_4_ = fVar12;
                auVar69._20_4_ = fVar12;
                auVar69._24_4_ = fVar12;
                auVar69._28_4_ = fVar12;
                auVar80 = vcmpps_avx(auVar70._0_32_,auVar69,2);
                local_1420 = vandps_avx(auVar80,local_1420);
                uVar55 = (ray->super_RayK<1>).mask;
                auVar136 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
              }
              if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1420 >> 0x7f,0) == '\0') &&
                    (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1420 >> 0xbf,0) == '\0') &&
                  (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1420[0x1f]) goto LAB_00b78ab6;
              auVar84._8_4_ = 0x7f800000;
              auVar84._0_8_ = 0x7f8000007f800000;
              auVar84._12_4_ = 0x7f800000;
              auVar84._16_4_ = 0x7f800000;
              auVar84._20_4_ = 0x7f800000;
              auVar84._24_4_ = 0x7f800000;
              auVar84._28_4_ = 0x7f800000;
              auVar80 = vblendvps_avx(auVar84,auVar70._0_32_,local_1420);
              auVar100 = vshufps_avx(auVar80,auVar80,0xb1);
              auVar100 = vminps_avx(auVar80,auVar100);
              auVar19 = vshufpd_avx(auVar100,auVar100,5);
              auVar100 = vminps_avx(auVar100,auVar19);
              auVar19 = vperm2f128_avx(auVar100,auVar100,1);
              auVar100 = vminps_avx(auVar100,auVar19);
              auVar100 = vcmpps_avx(auVar80,auVar100,0);
              auVar19 = local_1420 & auVar100;
              auVar80 = local_1420;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar80 = vandps_avx(auVar100,local_1420);
              }
              uVar57 = vmovmskps_avx(auVar80);
              uVar58 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                }
              }
              goto LAB_00b78734;
            }
          }
LAB_00b78ab6:
          auVar139 = ZEXT1664(local_1310);
          auVar144 = ZEXT1664(local_1320);
          auVar166 = ZEXT1664(local_1330);
          auVar180 = ZEXT1664(local_1340);
          auVar182 = ZEXT1664(local_1350);
          auVar193 = ZEXT1664(local_1360);
          auVar207 = ZEXT1664(local_1370);
          auVar209 = ZEXT1664(local_1380);
          auVar211 = ZEXT1664(local_1390);
          auVar136 = ZEXT1664(local_13f0);
        }
        fVar12 = (ray->super_RayK<1>).tfar;
        auVar70 = ZEXT1664(CONCAT412(fVar12,CONCAT48(fVar12,CONCAT44(fVar12,fVar12))));
      }
      goto LAB_00b77d16;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }